

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_enter_child_containers(MD_CTX *ctx,int n_children)

{
  MD_CONTAINER *pMVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  MD_CTX *in_RDI;
  int is_ordered_list;
  MD_CONTAINER *c;
  int ret;
  int i;
  MD_CTX *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  MD_BLOCKTYPE in_stack_ffffffffffffffd4;
  undefined4 uVar4;
  int local_14;
  int local_10;
  
  local_14 = 0;
  local_10 = in_RDI->n_containers - in_ESI;
  do {
    if (in_RDI->n_containers <= local_10) {
      return local_14;
    }
    pMVar1 = in_RDI->containers + local_10;
    uVar4 = 0;
    iVar2 = (int)pMVar1->ch;
    if (iVar2 == 0x29) {
LAB_00a09c14:
      uVar4 = 1;
LAB_00a09c1c:
      md_end_current_block(in_stack_ffffffffffffffc8);
      pMVar1->block_byte_off = in_RDI->n_block_bytes;
      iVar3 = md_push_container_bytes
                        ((MD_CTX *)CONCAT44(uVar4,iVar2),in_stack_ffffffffffffffd4,
                         in_stack_ffffffffffffffd0,(uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                         (uint)in_stack_ffffffffffffffc8);
      if (iVar3 < 0) {
        return iVar3;
      }
      in_stack_ffffffffffffffd4 = pMVar1->task_mark_off;
      in_stack_ffffffffffffffc8 = in_RDI;
      local_14 = md_push_container_bytes
                           ((MD_CTX *)CONCAT44(uVar4,iVar2),in_stack_ffffffffffffffd4,
                            in_stack_ffffffffffffffd0,(uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
joined_r0x00a09cf4:
      if (local_14 < 0) {
        return local_14;
      }
    }
    else {
      if ((iVar2 - 0x2aU < 2) || (iVar2 == 0x2d)) goto LAB_00a09c1c;
      if (iVar2 == 0x2e) goto LAB_00a09c14;
      if (iVar2 == 0x3e) {
        local_14 = md_push_container_bytes
                             ((MD_CTX *)0x3e,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                              (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                              (uint)in_stack_ffffffffffffffc8);
        goto joined_r0x00a09cf4;
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

static int
md_enter_child_containers(MD_CTX* ctx, int n_children)
{
    int i;
    int ret = 0;

    for(i = ctx->n_containers - n_children; i < ctx->n_containers; i++) {
        MD_CONTAINER* c = &ctx->containers[i];
        int is_ordered_list = FALSE;

        switch(c->ch) {
            case _T(')'):
            case _T('.'):
                is_ordered_list = TRUE;
                MD_FALLTHROUGH();

            case _T('-'):
            case _T('+'):
            case _T('*'):
                /* Remember offset in ctx->block_bytes so we can revisit the
                 * block if we detect it is a loose list. */
                md_end_current_block(ctx);
                c->block_byte_off = ctx->n_block_bytes;

                MD_CHECK(md_push_container_bytes(ctx,
                                (is_ordered_list ? MD_BLOCK_OL : MD_BLOCK_UL),
                                c->start, c->ch, MD_BLOCK_CONTAINER_OPENER));
                MD_CHECK(md_push_container_bytes(ctx, MD_BLOCK_LI,
                                c->task_mark_off,
                                (c->is_task ? CH(c->task_mark_off) : 0),
                                MD_BLOCK_CONTAINER_OPENER));
                break;

            case _T('>'):
                MD_CHECK(md_push_container_bytes(ctx, MD_BLOCK_QUOTE, 0, 0, MD_BLOCK_CONTAINER_OPENER));
                break;

            default:
                MD_UNREACHABLE();
                break;
        }
    }

abort:
    return ret;
}